

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::TiledRgbaInputFile::readTile(TiledRgbaInputFile *this,int dx,int dy,int l)

{
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  int in_stack_000001d0;
  int in_stack_000001d4;
  int in_stack_000001d8;
  int in_stack_000001dc;
  FromYa *in_stack_000001e0;
  TiledInputFile *in_stack_ffffffffffffffd0;
  
  if (*(long *)((long)&(in_RDI->super___mutex_base)._M_mutex + 0x10) == 0) {
    TiledInputFile::readTile(in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,0);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffffd0,in_RDI);
    FromYa::readTile(in_stack_000001e0,in_stack_000001dc,in_stack_000001d8,in_stack_000001d4,
                     in_stack_000001d0);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x24e390);
  }
  return;
}

Assistant:

void
TiledRgbaInputFile::readTile (int dx, int dy, int l)
{
    if (_fromYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_fromYa);
#endif
        _fromYa->readTile (dx, dy, l, l);
    }
    else { _inputFile->readTile (dx, dy, l); }
}